

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rf5c68.c
# Opt level: O2

UINT8 device_start_rf5c68_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA info;
  void *pvVar2;
  UINT8 UVar3;
  
  uVar1 = cfg->clock;
  info.chipInf = calloc(1,0xa8);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    *(undefined4 *)((long)info.chipInf + 0x8c) = 0x10000;
    pvVar2 = malloc(0x10000);
    ((DEV_DATA *)((long)info.chipInf + 0x90))->chipInf = pvVar2;
    UVar3 = '\0';
    rf5c68_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = uVar1 / 0x180;
    retDevInf->devDef = &devDef_RF5C68_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_rf5c68_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 384;
	chip = device_start_rf5c68(cfg->clock);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_RF5C68_MAME);
	return 0x00;
}